

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall
TLeonardoHeap<smoothsort_ptr<double>_>::filter
          (TLeonardoHeap<smoothsort_ptr<double>_> *this,size_t element,size_t order,
          bool test_children)

{
  ulong uVar1;
  bool bVar2;
  ulong local_48;
  size_t bitvector_mask;
  size_t size_current;
  size_t order_current;
  size_t current;
  bool test_children_local;
  size_t order_local;
  size_t element_local;
  TLeonardoHeap<smoothsort_ptr<double>_> *this_local;
  
  local_48 = 2;
  size_current = order;
  order_current = element;
  while ((uVar1 = Leonardo_k[size_current], uVar1 <= order_current &&
         (bVar2 = smoothsort_ptr<double>::operator>
                            (this->data + (order_current - uVar1),this->data + order_current), bVar2
         ))) {
    if ((uVar1 == 1) || (!test_children)) {
      swap(this,order_current,order_current - uVar1);
    }
    else {
      bVar2 = smoothsort_ptr<double>::operator>
                        (this->data + (order_current - uVar1),this->data + (order_current - 1));
      if ((!bVar2) ||
         (bVar2 = smoothsort_ptr<double>::operator>
                            (this->data + (order_current - uVar1),
                             this->data + ((order_current - 1) - Leonardo_k[size_current - 2])),
         !bVar2)) break;
      swap(this,order_current,order_current - uVar1);
    }
    while (size_current = size_current + 1, size_current < this->N + 1) {
      if ((this->tree_vector & local_48) != 0) {
        local_48 = local_48 << 1;
        break;
      }
      local_48 = local_48 << 1;
    }
    order_current = order_current - uVar1;
  }
  heapify(this,order_current,size_current);
  return;
}

Assistant:

inline void TLeonardoHeap<T>::filter(size_t element, size_t order, bool test_children) {
	size_t current = element;
	size_t order_current = order;
	size_t size_current;
	size_t bitvector_mask = 2;
	while(true) {
		// Check that there is a tree to the left
		size_current = Leonardo_k[order_current];
		if(size_current > current) { break; }
		
		// Determine whether root needs to be swapped with next tree to the left
		if(!(data[current-size_current] > data[current])) {
			break;
		} else if((size_current == 1) || !test_children) {	// Root of next tree greater than root of current tree
			swap(current, current-size_current);	// Singleton node, or current tree is already heapified
		} else {	// Current tree not singleton node and child nodes must be compared
			// Root of next tree greater than both children of root of current tree
			if((data[current-size_current] > data[current-1]) && (data[current-size_current] > data[current-1-Leonardo_k[order_current-2]])) {
				swap(current, current-size_current);
			} else {
				break;
			}
		}
		
		// Find the order of the next tree to the left
		order_current++;
		for(; order_current<N+1; order_current++, bitvector_mask<<=1) { // For is used just for the purposes of safety. A while loop would work too.
			if(tree_vector & bitvector_mask) { bitvector_mask <<= 1; break; }
		}
		// Shift the position marker leftwards
		current -= size_current;
	}
	heapify(current, order_current);
}